

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginCustomSection
          (BinaryReaderObjdump *this,Index section_index,Offset size,string_view section_name)

{
  PrintDetails(this," - name: \"%.*s\"\n",section_name._M_len & 0xffffffff,section_name._M_str);
  if (((this->super_BinaryReaderObjdumpBase).options_)->mode == Headers) {
    printf("\"%.*s\"\n",section_name._M_len & 0xffffffff,section_name._M_str);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginCustomSection(Index section_index,
                                               Offset size,
                                               std::string_view section_name) {
  PrintDetails(" - name: \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(section_name));
  if (options_->mode == ObjdumpMode::Headers) {
    printf("\"" PRIstringview "\"\n",
           WABT_PRINTF_STRING_VIEW_ARG(section_name));
  }
  return Result::Ok;
}